

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.hpp
# Opt level: O0

void __thiscall helics::TimeData::TimeData(TimeData *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = 0xffffffffffffffff;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  memset((GlobalFederateId *)(in_RDI + 5),0,4);
  GlobalFederateId::GlobalFederateId((GlobalFederateId *)(in_RDI + 5));
  memset((GlobalFederateId *)((long)in_RDI + 0x2c),0,4);
  GlobalFederateId::GlobalFederateId((GlobalFederateId *)((long)in_RDI + 0x2c));
  *(undefined1 *)(in_RDI + 6) = 0;
  *(undefined1 *)((long)in_RDI + 0x31) = 0;
  *(undefined1 *)((long)in_RDI + 0x32) = 0;
  *(undefined1 *)((long)in_RDI + 0x33) = 0;
  *(undefined1 *)((long)in_RDI + 0x34) = 0xfe;
  *(undefined1 *)((long)in_RDI + 0x35) = 0;
  *(undefined4 *)(in_RDI + 7) = 0;
  *(undefined4 *)((long)in_RDI + 0x3c) = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)((long)in_RDI + 0x44) = 0;
  return;
}

Assistant:

TimeData() = default;